

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O1

function<void_()> * __thiscall
Liby::BlockingQueue<std::function<void_()>_>::pop_front
          (function<void_()> *__return_storage_ptr__,BlockingQueue<std::function<void_()>_> *this)

{
  int iVar1;
  undefined8 uVar2;
  value_type *t;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    std::function<void_()>::function
              (__return_storage_ptr__,
               (function<void_()> *)
               ((this->queue_).
                super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_M_erase
              (&this->queue_,
               (this->queue_).
               super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl._M_node.super__List_node_base._M_next);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar2);
}

Assistant:

T pop_front() {
        std::lock_guard<std::mutex> G_(mutex_);
        return pop_front_imp();
    }